

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateFastInlineGlobalObjectParseInt(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  undefined4 *puVar5;
  Instr *argoutInlineSpecialized;
  SymOpnd *pSVar6;
  StackSym *this_00;
  Instr *pIVar7;
  LabelInstr *target;
  LabelInstr *labelHelper;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e50,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar3) goto LAB_0054b8ac;
    *puVar5 = 0;
  }
  argoutInlineSpecialized = Inline::GetDefInstr(instr->m_src2);
  pOVar1 = argoutInlineSpecialized->m_src2;
  pSVar6 = IR::Opnd::AsSymOpnd(pOVar1);
  this_00 = Sym::AsStackSym(pSVar6->m_sym);
  AVar4 = StackSym::GetArgSlotNum(this_00);
  if (AVar4 != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e5f,"(argCount == 2)","argCount == 2");
    if (!bVar3) goto LAB_0054b8ac;
    *puVar5 = 0;
  }
  pIVar7 = Inline::GetDefInstr(pOVar1);
  if (pIVar7->m_opcode != ArgOut_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e63,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A");
    if (!bVar3) {
LAB_0054b8ac:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pOVar1 = pIVar7->m_src1;
  local_32 = (pOVar1->m_valueType).field_0;
  bVar3 = ValueType::IsLikelyNumber((ValueType *)&local_32.field_0);
  if (bVar3) {
    target = IR::LabelInstr::New(Label,this->m_func,false);
    labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
    bVar3 = IR::Opnd::IsTaggedInt(pOVar1);
    if (!bVar3) {
      LowererMD::GenerateSmIntTest(&this->m_lowererMD,pOVar1,instr,labelHelper,(Instr **)0x0,false);
    }
    if (instr->m_dst != (Opnd *)0x0) {
      InsertMove(instr->m_dst,pOVar1,instr,true);
    }
    InsertBranch(Br,target,instr);
    IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
    IR::Instr::InsertAfter(instr,&target->super_Instr);
    RelocateCallDirectToHelperPath((Lowerer *)instr,argoutInlineSpecialized,labelHelper);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateFastInlineGlobalObjectParseInt(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

//  ArgOut sequence
//  s8.var          =  StartCall      2 (0x2).i32                             #000c
//  arg1(s9)<0>.var =  ArgOut_A       s2.var, s8.var                          #0014 //Implicit this, global object
//  arg2(s10)<4>.var = ArgOut_A       s3.var, arg1(s9)<0>.var                 #0018 //First argument to parseInt
//  arg1(s11)<0>.u32 = ArgOut_A_InlineSpecialized  0x012C26C0 (DynamicObject).var, arg2(s10)<4>.var #
//  s0[LikelyTaggedInt].var = CallDirect  GlobalObject_ParseInt.u32, arg1(s11)<0>.u32 #001c

    IR::Opnd * linkOpnd = instr->GetSrc2();
    IR::Instr * tmpInstr = Inline::GetDefInstr(linkOpnd);// linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;
    linkOpnd = tmpInstr->GetSrc2();

#if DBG
    IntConstType argCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
    Assert(argCount == 2);
#endif

    IR::Instr *argInstr = Inline::GetDefInstr(linkOpnd);
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A);
    IR::Opnd *parseIntArgOpnd = argInstr->GetSrc1();

    if (parseIntArgOpnd->GetValueType().IsLikelyNumber())
    {
        //If likely int check for tagged int and set the dst
        IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        if (!parseIntArgOpnd->IsTaggedInt())
        {
            this->m_lowererMD.GenerateSmIntTest(parseIntArgOpnd, instr, labelHelper);
        }
        if (instr->GetDst())
        {
            this->InsertMove(instr->GetDst(), parseIntArgOpnd, instr);
        }
        InsertBranch(Js::OpCode::Br, doneLabel, instr);
        instr->InsertBefore(labelHelper);
        instr->InsertAfter(doneLabel);

        RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
    }
    return true;
}